

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall ktx::CommandExtract::saveEXR::EXRStruct::~EXRStruct(EXRStruct *this)

{
  EXRAttribute *__ptr;
  pointer p_Var1;
  
  __ptr = (this->header).custom_attributes;
  if (__ptr != (EXRAttribute *)0x0) {
    free(__ptr);
    (this->header).custom_attributes = (EXRAttribute *)0x0;
    (this->header).num_custom_attributes = 0;
  }
  (this->image).images = (uchar **)0x0;
  FreeEXRImage(&this->image);
  FreeEXRHeader(&this->header);
  FreeEXRErrorMessage(this->err);
  free(this->fileData);
  p_Var1 = (this->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (p_Var1 != (pointer)0x0) {
    operator_delete(p_Var1,(long)(this->attributes).
                                 super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)p_Var1);
    return;
  }
  return;
}

Assistant:

~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }